

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O1

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::prepare_close
          (hybi13<websocketpp::config::asio> *this,value code,string *reason,message_ptr *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  error_category *peVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  error_code eVar5;
  string payload;
  string local_68;
  message_ptr local_48;
  
  if ((int)CONCAT62(in_register_00000032,code) == 0x3ec || (ushort)(code - 0x3f8) < 0x7c0) {
    if (error::get_processor_category()::instance == '\0') {
      prepare_close();
      peVar3 = (error_category *)local_68._M_string_length;
      uVar4 = (uint)local_68._M_dataplus._M_p;
    }
    else {
      peVar3 = (error_category *)&error::get_processor_category()::instance;
      uVar4 = 0x18;
    }
  }
  else if ((code == 0x3ed) ||
          (code != 0x3f7 && (0xf05f < (ushort)(code + 0xec78) && 1 < (ushort)(code - 0x3ed)))) {
    if ((code == 0x3ed) && (reason->_M_string_length != 0)) {
      if (error::get_processor_category()::instance == '\0') {
        prepare_close();
        peVar3 = (error_category *)local_68._M_string_length;
        uVar4 = (uint)local_68._M_dataplus._M_p;
      }
      else {
        peVar3 = (error_category *)&error::get_processor_category()::instance;
        uVar4 = 0x1a;
      }
    }
    else if (reason->_M_string_length < 0x7c) {
      paVar1 = &local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)paVar1;
      if (code != 0x3ed) {
        std::__cxx11::string::resize((ulong)&local_68,(char)reason->_M_string_length + '\x02');
        *local_68._M_dataplus._M_p = (char)(code >> 8);
        local_68._M_dataplus._M_p[1] = (char)code;
        if (reason->_M_string_length != 0) {
          memmove(local_68._M_dataplus._M_p + 2,(reason->_M_dataplus)._M_p,reason->_M_string_length)
          ;
        }
      }
      p_Var2 = (out->
               super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      local_48.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (out->
                super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_48.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (out->
           super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      eVar5 = prepare_control(this,CLOSE,&local_68,&local_48);
      if (local_48.
          super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.
                   super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      peVar3 = eVar5._M_cat;
      uVar4 = eVar5._M_value;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    else if (error::get_processor_category()::instance == '\0') {
      prepare_close();
      peVar3 = (error_category *)local_68._M_string_length;
      uVar4 = (uint)local_68._M_dataplus._M_p;
    }
    else {
      peVar3 = (error_category *)&error::get_processor_category()::instance;
      uVar4 = 8;
    }
  }
  else if (error::get_processor_category()::instance == '\0') {
    prepare_close();
    peVar3 = (error_category *)local_68._M_string_length;
    uVar4 = (uint)local_68._M_dataplus._M_p;
  }
  else {
    peVar3 = (error_category *)&error::get_processor_category()::instance;
    uVar4 = 0x19;
  }
  eVar5._4_4_ = 0;
  eVar5._M_value = uVar4;
  eVar5._M_cat = peVar3;
  return eVar5;
}

Assistant:

virtual lib::error_code prepare_close(close::status::value code,
        std::string const & reason, message_ptr out) const
    {
        if (close::status::reserved(code)) {
            return make_error_code(error::reserved_close_code);
        }

        if (close::status::invalid(code) && code != close::status::no_status) {
            return make_error_code(error::invalid_close_code);
        }

        if (code == close::status::no_status && reason.size() > 0) {
            return make_error_code(error::reason_requires_code);
        }

        if (reason.size() > frame:: limits::payload_size_basic-2) {
            return make_error_code(error::control_too_big);
        }

        std::string payload;

        if (code != close::status::no_status) {
            close::code_converter val;
            val.i = htons(code);

            payload.resize(reason.size()+2);

            payload[0] = val.c[0];
            payload[1] = val.c[1];

            std::copy(reason.begin(),reason.end(),payload.begin()+2);
        }

        return this->prepare_control(frame::opcode::CLOSE,payload,out);
    }